

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_common.c
# Opt level: O1

GLXFBConfig get_fbconfig_for_visinfo(Display *dpy,XVisualInfo *visinfo)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int nconfigs;
  int v;
  int local_44;
  GLXFBConfig local_40;
  int local_34;
  
  lVar3 = (*_epoxy_glXGetFBConfigs)(dpy,visinfo->screen,&local_44);
  if (lVar3 == 0) {
    local_40 = (GLXFBConfig)0x0;
  }
  else {
    if (local_44 < 1) {
      local_40 = (GLXFBConfig)0x0;
    }
    else {
      lVar4 = 0;
      local_40 = (GLXFBConfig)0x0;
      do {
        iVar2 = (*_epoxy_glXGetFBConfigAttrib)
                          (dpy,*(undefined8 *)(lVar3 + lVar4 * 8),0x800b,&local_34);
        if ((iVar2 == 0) && (local_34 == (int)visinfo->visualid)) {
          local_40 = *(GLXFBConfig *)(lVar3 + lVar4 * 8);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      } while ((!bVar1) && (lVar4 = lVar4 + 1, lVar4 < local_44));
    }
    XFree(lVar3);
  }
  return local_40;
}

Assistant:

GLXFBConfig
get_fbconfig_for_visinfo(Display *dpy, XVisualInfo *visinfo)
{
	int i, nconfigs;
	GLXFBConfig ret = None, *configs;

	configs = glXGetFBConfigs(dpy, visinfo->screen, &nconfigs);
	if (!configs)
		return None;

	for (i = 0; i < nconfigs; i++) {
		int v;

		if (glXGetFBConfigAttrib(dpy, configs[i], GLX_VISUAL_ID, &v))
			continue;

		if (v == (int)visinfo->visualid) {
			ret = configs[i];
			break;
		}
	}

	XFree(configs);
	return ret;
}